

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O3

void __thiscall chipemu::implementation::nmos::set_node(nmos *this,uint id,bool high)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_short *puVar3;
  byte bVar4;
  ushort uVar5;
  
  if (id - 1 < (uint)this->desc_nodes_count) {
    puVar1 = (this->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->node_offsets).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 2;
    bVar4 = (byte)puVar1[puVar2[id]];
    if ((((bVar4 & !high) != 0) || (uVar5 = 1, ((~high | bVar4) & 1) == 0)) &&
       (puVar1[puVar2[id]] = uVar5 | puVar1[puVar2[id]] & 0xfffc, (puVar1[puVar2[id]] & 8) == 0)) {
      puVar3 = (this->changed_feeding)._M_current;
      *puVar3 = (unsigned_short)id;
      puVar3 = puVar3 + 1;
      (this->changed_feeding)._M_current = puVar3;
      if (puVar3 == (this->changed_queue).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        (this->changed_feeding)._M_current =
             (this->changed_queue).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      puVar1[puVar2[id]] = puVar1[puVar2[id]] | 8;
    }
  }
  return;
}

Assistant:

void
nmos::set_node(unsigned id, bool high) noexcept
{
    if (id > 0 and id <= node_count()) {
        uint16_t *node = node_addr(id);

        if ((*node & node_is_pullup) and not high) {
            *node &= ~node_is_pullup;
            *node |= node_is_pulldown;
        }
        else if (high and not (*node & node_is_pullup)) {
            *node |= node_is_pullup;
            *node &= ~node_is_pulldown;
        }
        else return;

        changed_push(id);
    }
}